

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O3

Error __thiscall asmjit::v1_14::BaseAssembler::embed(BaseAssembler *this,void *data,size_t dataSize)

{
  CodeHolder *this_00;
  Section *pSVar1;
  ulong uVar2;
  Logger *pLVar3;
  Error extraout_EAX;
  Error EVar4;
  ulong uVar5;
  undefined1 *puVar6;
  uint8_t *__dest;
  undefined8 local_248;
  ulong uStack_240;
  undefined8 local_238;
  undefined1 *local_230;
  undefined1 local_228 [520];
  
  this_00 = (this->super_BaseEmitter)._code;
  if (this_00 == (CodeHolder *)0x0) {
    EVar4 = BaseEmitter::reportError(&this->super_BaseEmitter,5,(char *)0x0);
    return EVar4;
  }
  if (dataSize == 0) {
LAB_001153c2:
    EVar4 = 0;
  }
  else {
    __dest = this->_bufferPtr;
    if ((ulong)((long)this->_bufferEnd - (long)__dest) < dataSize) {
      EVar4 = CodeHolder::growBuffer(this_00,&this->_section->_buffer,dataSize);
      if (EVar4 != 0) goto LAB_00115418;
      __dest = this->_bufferPtr;
    }
    do {
      memcpy(__dest,data,dataSize);
      __dest = __dest + dataSize;
      pSVar1 = this->_section;
      uVar5 = (long)__dest - (long)this->_bufferData;
      if (uVar5 <= (pSVar1->_buffer)._capacity) {
        this->_bufferPtr = __dest;
        uVar2 = (pSVar1->_buffer)._size;
        if (uVar5 < uVar2) {
          uVar5 = uVar2;
        }
        (pSVar1->_buffer)._size = uVar5;
        pLVar3 = (this->super_BaseEmitter)._logger;
        if (pLVar3 != (Logger *)0x0) {
          local_230 = local_228;
          uStack_240 = 0;
          local_248 = 0x20;
          local_238 = 0x207;
          local_228[0] = 0;
          Formatter::formatData
                    ((String *)&local_248,(pLVar3->_options)._flags,
                     (this->super_BaseEmitter)._environment._arch,kUInt8,data,dataSize,1);
          String::_opChar((String *)&local_248,kAppend,'\n');
          pLVar3 = (this->super_BaseEmitter)._logger;
          uVar5 = uStack_240;
          puVar6 = local_230;
          if ((local_248 & 0xff) < 0x1f) {
            uVar5 = local_248 & 0xff;
            puVar6 = (undefined1 *)((long)&local_248 + 1);
          }
          (*pLVar3->_vptr_Logger[2])(pLVar3,puVar6,uVar5);
          String::reset((String *)&local_248);
        }
        goto LAB_001153c2;
      }
      embed();
      EVar4 = extraout_EAX;
LAB_00115418:
      EVar4 = BaseEmitter::reportError(&this->super_BaseEmitter,EVar4,(char *)0x0);
    } while (EVar4 == 0);
  }
  return EVar4;
}

Assistant:

Error BaseAssembler::embed(const void* data, size_t dataSize) {
  if (ASMJIT_UNLIKELY(!_code))
    return reportError(DebugUtils::errored(kErrorNotInitialized));

  if (dataSize == 0)
    return kErrorOk;

  CodeWriter writer(this);
  ASMJIT_PROPAGATE(writer.ensureSpace(this, dataSize));

  writer.emitData(data, dataSize);
  writer.done(this);

#ifndef ASMJIT_NO_LOGGING
  if (_logger) {
    StringTmp<512> sb;
    Formatter::formatData(sb, _logger->flags(), arch(), TypeId::kUInt8, data, dataSize, 1);
    sb.append('\n');
    _logger->log(sb);
  }
#endif

  return kErrorOk;
}